

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cc
# Opt level: O1

void __thiscall xLearn::Solver::checker(Solver *this,HyperParam *hyper_param)

{
  bool bVar1;
  string local_30;
  
  bVar1 = Checker::check_param(&this->checker_,hyper_param);
  if (bVar1) {
    return;
  }
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_30,"Arguments error","");
  Color::print_error(&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  exit(0);
}

Assistant:

void Solver::checker(HyperParam& hyper_param) {
  if (!checker_.check_param(hyper_param)) {
    Color::print_error("Arguments error");
    exit(0);
  }
}